

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

float matrix4_determinant(matrix4 *self)

{
  float determinant;
  matrix4 *self_local;
  
  return -((self->field_0).m[3] * (self->field_0).m[6] * (self->field_0).m[8]) *
         (self->field_0).m[0xd] +
         -((self->field_0).m[3] * (self->field_0).m[5] * (self->field_0).m[10]) *
         (self->field_0).m[0xc] +
         -((self->field_0).m[3] * (self->field_0).m[4] * (self->field_0).m[9]) *
         (self->field_0).m[0xe] +
         -((self->field_0).m[2] * (self->field_0).m[7] * (self->field_0).m[9]) *
         (self->field_0).m[0xc] +
         -((self->field_0).m[2] * (self->field_0).m[5] * (self->field_0).m[8]) *
         (self->field_0).m[0xf] +
         -((self->field_0).m[2] * (self->field_0).m[4] * (self->field_0).m[0xb]) *
         (self->field_0).m[0xd] +
         -((self->field_0).m[1] * (self->field_0).m[7] * (self->field_0).m[8]) *
         (self->field_0).m[0xe] +
         -((self->field_0).m[1] * (self->field_0).m[6] * (self->field_0).m[0xb]) *
         (self->field_0).m[0xc] +
         -((self->field_0).m[1] * (self->field_0).m[4] * (self->field_0).m[10]) *
         (self->field_0).m[0xf] +
         -((self->field_0).m[0] * (self->field_0).m[7] * (self->field_0).m[10]) *
         (self->field_0).m[0xd] +
         -((self->field_0).m[0] * (self->field_0).m[6] * (self->field_0).m[9]) *
         (self->field_0).m[0xf] +
         -((self->field_0).m[0] * (self->field_0).m[5] * (self->field_0).m[0xb]) *
         (self->field_0).m[0xe] +
         (self->field_0).m[3] * (self->field_0).m[6] * (self->field_0).m[9] * (self->field_0).m[0xc]
         + (self->field_0).m[3] * (self->field_0).m[5] * (self->field_0).m[8] *
           (self->field_0).m[0xe] +
           (self->field_0).m[3] * (self->field_0).m[4] * (self->field_0).m[10] *
           (self->field_0).m[0xd] +
           (self->field_0).m[2] * (self->field_0).m[7] * (self->field_0).m[8] *
           (self->field_0).m[0xd] +
           (self->field_0).m[2] * (self->field_0).m[5] * (self->field_0).m[0xb] *
           (self->field_0).m[0xc] +
           (self->field_0).m[2] * (self->field_0).m[4] * (self->field_0).m[9] *
           (self->field_0).m[0xf] +
           (self->field_0).m[1] * (self->field_0).m[7] * (self->field_0).m[10] *
           (self->field_0).m[0xc] +
           (self->field_0).m[1] * (self->field_0).m[6] * (self->field_0).m[8] *
           (self->field_0).m[0xf] +
           (self->field_0).m[1] * (self->field_0).m[4] * (self->field_0).m[0xb] *
           (self->field_0).m[0xe] +
           (self->field_0).m[0] * (self->field_0).m[7] * (self->field_0).m[9] *
           (self->field_0).m[0xe] +
           (self->field_0).m[0] * (self->field_0).m[5] * (self->field_0).m[10] *
           (self->field_0).m[0xf] +
           (self->field_0).m[0] * (self->field_0).m[6] * (self->field_0).m[0xb] *
           (self->field_0).m[0xd];
}

Assistant:

HYPAPI HYP_FLOAT matrix4_determinant(const struct matrix4 *self)
{
	HYP_FLOAT determinant;

	/* using the Leibniz formula */
	/* avoids temporary structures */

	determinant =
	  A4(11, 22, 33, 44) + A4(11, 23, 34, 42) + A4(11, 24, 32, 43)
	+ A4(12, 21, 34, 43) + A4(12, 23, 31, 44) + A4(12, 24, 33, 41)
	+ A4(13, 21, 32, 44) + A4(13, 22, 34, 41) + A4(13, 24, 31, 42)
	+ A4(14, 21, 33, 42) + A4(14, 22, 31, 43) + A4(14, 23, 32, 41)
	- A4(11, 22, 34, 43) - A4(11, 23, 32, 44) - A4(11, 24, 33, 42)
	- A4(12, 21, 33, 44) - A4(12, 23, 34, 41) - A4(12, 24, 31, 43)
	- A4(13, 21, 34, 42) - A4(13, 22, 31, 44) - A4(13, 24, 32, 41)
	- A4(14, 21, 32, 43) - A4(14, 22, 33, 41) - A4(14, 23, 31, 42)
	;

	return determinant;
}